

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O3

ssize_t __thiscall dummy_api::write(dummy_api *this,int __fd,void *__buf,size_t __n)

{
  iterator __position;
  undefined8 uVar1;
  int iVar2;
  undefined4 in_register_00000034;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  const_buffer in;
  char local_78;
  undefined7 uStack_77;
  undefined1 local_68 [16];
  int local_58 [2];
  undefined1 local_50 [16];
  undefined1 *local_40;
  long local_38;
  
  (**(code **)(*(long *)this + 0x50))
            (local_58,this,CONCAT44(in_register_00000034,__fd),(ulong)__buf & 0xffffffff,__n);
  iVar2 = std::__cxx11::string::compare((char *)this->output_);
  uVar1 = booster::aio::aio_error_cat;
  if (iVar2 == 0) {
    *(undefined4 *)__n = 3;
    *(undefined8 *)(__n + 8) = uVar1;
    uVar4 = 0;
    goto LAB_0013044b;
  }
  std::__cxx11::string::substr((ulong)&local_78,(ulong)this->output_);
  iVar2 = std::__cxx11::string::compare(&local_78);
  uVar4 = CONCAT71((int7)(__n >> 8),iVar2 != 0);
  if ((undefined1 *)CONCAT71(uStack_77,local_78) != local_68) {
    operator_delete((undefined1 *)CONCAT71(uStack_77,local_78));
  }
  if (iVar2 == 0) {
    __position._M_current = *(char **)&this->field_0x68;
    if (*(char **)&this->field_0x60 == __position._M_current) {
      local_78 = 'x';
      if (*(char **)&this->field_0x60 == *(char **)&this->field_0x70) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  ((vector<char,_std::allocator<char>_> *)&this->field_0x60,__position,&local_78);
      }
      else {
        *__position._M_current = 'x';
        *(long *)&this->field_0x68 = *(long *)&this->field_0x68 + 1;
      }
    }
  }
  if (local_58[0] != 0) {
    if (local_58[0] == 1) {
      lVar3 = 1;
      puVar5 = local_50;
    }
    else {
      if (local_38 - (long)local_40 == 0) goto LAB_0013042a;
      lVar3 = local_38 - (long)local_40 >> 4;
      puVar5 = local_40;
    }
    if (this->mark_chunks_ == true) {
      std::__cxx11::string::append((char *)this->output_);
    }
    if (lVar3 != 0) {
      puVar5 = puVar5 + 8;
      do {
        std::__cxx11::string::append((char *)this->output_,*(ulong *)(puVar5 + -8));
        puVar5 = puVar5 + 0x10;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    if (this->mark_chunks_ != false) {
      std::__cxx11::string::append((char *)this->output_);
    }
  }
LAB_0013042a:
  if (((char)((ulong)__buf & 0xffffffff) != '\0') && (this->write_eof_ == true)) {
    std::__cxx11::string::append((char *)this->output_);
  }
LAB_0013044b:
  if (local_40 != (undefined1 *)0x0) {
    operator_delete(local_40);
  }
  return uVar4 & 0xffffffff;
}

Assistant:

virtual bool write(booster::aio::const_buffer const &body_in,bool eof,booster::system::error_code &e) 
	{
		booster::aio::const_buffer in = format_output(body_in,eof,e);
		if(*output_ == "$$$ERROR$$$") {
			e=booster::system::error_code(booster::aio::aio_error::eof,booster::aio::aio_error_cat);
			return false;
		}
		bool block = false;
		if(output_->substr(0,3+5+3) == "$$$BLOCK$$$") {
			if(pending_output_.empty())
				pending_output_.push_back('x');
			block = true;
		}
		std::pair<booster::aio::const_buffer::entry const *,size_t> all=in.get();
		if(all.second!=0) {
			if(mark_chunks_)
				output_->append("[");
			for(size_t i=0;i<all.second;i++)  {
				output_->append(reinterpret_cast<char const *>(all.first[i].ptr),all.first[i].size);
			}
			if(mark_chunks_)
				output_->append("]");
		}
		if(eof && write_eof_)
			output_->append("[EOF]");
		return !block;
	}